

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O2

const_iterator * __thiscall
pstack::Dwarf::DIE::Children::begin(const_iterator *__return_storage_ptr__,Children *this)

{
  DIE local_48;
  
  firstChild(&local_48,this->parent);
  const_iterator::const_iterator(__return_storage_ptr__,&local_48,this->parent);
  ~DIE(&local_48);
  return __return_storage_ptr__;
}

Assistant:

DIE::Children::const_iterator
DIE::Children::begin() const {
    return const_iterator(parent.firstChild(), parent);
}